

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

void __thiscall
capnp::_::BuilderArena::BuilderArena
          (BuilderArena *this,MessageBuilder *message,
          ArrayPtr<capnp::MessageBuilder::SegmentInit> segments)

{
  ArrayPtr<const_capnp::word> *pAVar1;
  word *pwVar2;
  Disposer *pDVar3;
  Disposer *pDVar4;
  MultiSegmentState *pMVar5;
  ArrayPtr<const_capnp::word> *pAVar6;
  RemoveConst<kj::ArrayPtr<const_capnp::word>_> *pRVar7;
  ArrayPtr<const_capnp::word> *pAVar8;
  Own<capnp::_::SegmentBuilder> *pOVar9;
  RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *pRVar10;
  Own<capnp::_::SegmentBuilder> *pOVar11;
  BuilderArena *pBVar12;
  ArrayDisposer *pAVar13;
  SegmentBuilder *pSVar14;
  SegmentBuilder *pSVar15;
  MultiSegmentState *pMVar16;
  ulong uVar17;
  SegmentInit *pSVar18;
  uint uVar19;
  size_t newSize;
  ArrayDisposer *pAVar20;
  SegmentBuilder *ptrCopy;
  Vector<kj::ArrayPtr<const_capnp::word>_> forOutput;
  Vector<kj::Own<capnp::_::SegmentBuilder>_> builders;
  Vector<kj::ArrayPtr<const_capnp::word>_> local_d8;
  Vector<kj::Own<capnp::_::SegmentBuilder>_> local_b8;
  BuilderArena *local_98;
  SegmentBuilder *local_90;
  ArrayDisposer *local_88;
  SegmentBuilder *local_80;
  Own<capnp::_::SegmentBuilder> local_78;
  SegmentBuilder *local_68;
  ArrayDisposer *local_60;
  ArrayPtr<const_capnp::word> *local_58;
  ArrayPtr<const_capnp::word> *pAStack_50;
  ArrayPtr<const_capnp::word> *local_48;
  ArrayDisposer *local_40;
  
  uVar17 = segments.size_;
  pSVar18 = segments.ptr;
  (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__BuilderArena_0064a200;
  this->message = message;
  (this->dummyLimiter).limit = 0xffffffffffffffff;
  (this->localCapTable).super_CapTableBuilder.super_CapTableReader._vptr_CapTableReader =
       (_func_int **)&PTR_extractCap_0064a2b8;
  (this->localCapTable).capTable.builder.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
  (this->localCapTable).capTable.builder.pos =
       (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
  (this->localCapTable).capTable.builder.endPtr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
  pwVar2 = (pSVar18->space).ptr;
  pDVar3 = (Disposer *)(pSVar18->space).size_;
  local_b8.builder.ptr = &local_78;
  local_78.disposer = pDVar3;
  local_98 = this;
  if (((Disposer *)0x1fffffff < pDVar3) ||
     (local_78.disposer = (Disposer *)pSVar18->wordsUsed, (Disposer *)0x1fffffff < local_78.disposer
     )) {
    verifySegmentSize::anon_class_8_1_89918cff::operator()((anon_class_8_1_89918cff *)&local_b8);
  }
  local_80 = (SegmentBuilder *)&this->dummyLimiter;
  (this->segment0).super_SegmentReader.arena = &this->super_Arena;
  (this->segment0).super_SegmentReader.id.value = 0;
  (this->segment0).super_SegmentReader.ptr.ptr = pwVar2;
  (this->segment0).super_SegmentReader.ptr.size_ = (size_t)pDVar3;
  (this->segment0).super_SegmentReader.readLimiter = (ReadLimiter *)local_80;
  (this->segment0).pos = pwVar2 + (long)local_78.disposer;
  (this->segment0).readOnly = false;
  (this->segment0ForOutput).ptr = (word *)0x0;
  (this->segment0ForOutput).size_ = 0;
  (this->moreSegments).ptr.disposer = (Disposer *)0x0;
  (this->moreSegments).ptr.ptr = (MultiSegmentState *)0x0;
  this->segmentWithSpace = (SegmentBuilder *)0x0;
  if (uVar17 < 2) {
    this->segmentWithSpace = &this->segment0;
  }
  else {
    local_b8.builder.ptr =
         (Own<capnp::_::SegmentBuilder> *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (0x10,0,uVar17 - 1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_b8.builder.endPtr =
         (Own<capnp::_::SegmentBuilder> *)((long)local_b8.builder.ptr + (uVar17 - 1) * 0x10);
    local_b8.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_90 = (SegmentBuilder *)(uVar17 * 0x18);
    local_b8.builder.pos = local_b8.builder.ptr;
    local_88 = (ArrayDisposer *)uVar17;
    if (local_90 != (SegmentBuilder *)&DAT_00000018) {
      local_90 = (SegmentBuilder *)
                 ((long)&(((SegmentInit *)local_90)->space).ptr + (long)&(pSVar18->space).ptr);
      pSVar18 = pSVar18 + 1;
      uVar19 = 1;
      do {
        pwVar2 = (pSVar18->space).ptr;
        pDVar3 = (Disposer *)(pSVar18->space).size_;
        local_d8.builder.ptr = (ArrayPtr<const_capnp::word> *)&local_78;
        if ((Disposer *)0x1fffffff < pDVar3) {
          local_78.disposer = pDVar3;
          verifySegmentSize::anon_class_8_1_89918cff::operator()
                    ((anon_class_8_1_89918cff *)&local_d8);
        }
        pDVar4 = (Disposer *)pSVar18->wordsUsed;
        local_78.disposer = pDVar4;
        if ((Disposer *)0x1fffffff < pDVar4) {
          verifySegmentSize::anon_class_8_1_89918cff::operator()
                    ((anon_class_8_1_89918cff *)&local_d8);
        }
        pSVar15 = (SegmentBuilder *)operator_new(0x38);
        (pSVar15->super_SegmentReader).arena = &local_98->super_Arena;
        (pSVar15->super_SegmentReader).id.value = uVar19;
        (pSVar15->super_SegmentReader).ptr.ptr = pwVar2;
        (pSVar15->super_SegmentReader).ptr.size_ = (size_t)pDVar3;
        (pSVar15->super_SegmentReader).readLimiter = (ReadLimiter *)local_80;
        pSVar15->pos = pwVar2 + (long)pDVar4;
        pSVar15->readOnly = false;
        if (local_b8.builder.pos == local_b8.builder.endPtr) {
          newSize = (long)local_b8.builder.endPtr - (long)local_b8.builder.ptr >> 3;
          if (local_b8.builder.endPtr == local_b8.builder.ptr) {
            newSize = 4;
          }
          kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::setCapacity(&local_b8,newSize);
        }
        ((SegmentReader *)&(local_b8.builder.pos)->disposer)->arena =
             (Arena *)&kj::_::HeapDisposer<capnp::_::SegmentBuilder>::instance;
        *(SegmentBuilder **)&((SegmentReader *)&(local_b8.builder.pos)->disposer)->id = pSVar15;
        local_b8.builder.pos =
             (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)
             &((SegmentReader *)&(local_b8.builder.pos)->disposer)->ptr;
        pSVar18 = pSVar18 + 1;
        uVar19 = uVar19 + 1;
      } while ((SegmentBuilder *)pSVar18 != local_90);
    }
    pAVar13 = local_88;
    local_d8.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_d8.builder.pos = (ArrayPtr<const_capnp::word> *)0x0;
    local_d8.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    if (local_88 != (ArrayDisposer *)0x0) {
      pAVar20 = (ArrayDisposer *)4;
      if (4 < local_88) {
        pAVar20 = local_88;
      }
      kj::Vector<kj::ArrayPtr<const_capnp::word>_>::setCapacity(&local_d8,(size_t)pAVar20);
    }
    pBVar12 = local_98;
    pRVar10 = local_b8.builder.pos;
    pAVar20 = local_d8.builder.disposer;
    pAVar8 = local_d8.builder.endPtr;
    pAVar6 = local_d8.builder.ptr;
    pAVar1 = local_d8.builder.ptr + (long)pAVar13;
    while (local_d8.builder.pos < local_d8.builder.ptr + (long)pAVar13) {
      (local_d8.builder.pos)->ptr = (word *)0x0;
      (local_d8.builder.pos)->size_ = 0;
      pAVar1 = local_d8.builder.pos + 1;
      local_d8.builder.pos = pAVar1;
    }
    local_98->segmentWithSpace =
         *(SegmentBuilder **)&((SegmentBuilder *)((long)local_b8.builder.pos + -0x38))->readOnly;
    local_90 = (SegmentBuilder *)local_b8.builder.ptr;
    local_78.disposer = (Disposer *)local_b8.builder.ptr;
    local_78.ptr = (SegmentBuilder *)local_b8.builder.pos;
    local_80 = (SegmentBuilder *)local_b8.builder.endPtr;
    local_68 = (SegmentBuilder *)local_b8.builder.endPtr;
    local_88 = local_b8.builder.disposer;
    local_60 = local_b8.builder.disposer;
    local_b8.builder.ptr = (Own<capnp::_::SegmentBuilder> *)0x0;
    local_b8.builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
    local_b8.builder.endPtr = (Own<capnp::_::SegmentBuilder> *)0x0;
    local_58 = local_d8.builder.ptr;
    local_48 = local_d8.builder.endPtr;
    local_40 = local_d8.builder.disposer;
    local_d8.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_d8.builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    local_d8.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    pAStack_50 = pAVar1;
    pMVar16 = (MultiSegmentState *)operator_new(0x40);
    (pMVar16->builders).builder.ptr = (Own<capnp::_::SegmentBuilder> *)local_90;
    (pMVar16->builders).builder.pos = pRVar10;
    (pMVar16->builders).builder.endPtr = (Own<capnp::_::SegmentBuilder> *)local_80;
    (pMVar16->builders).builder.disposer = local_88;
    local_68 = (SegmentBuilder *)0x0;
    local_78.disposer = (Disposer *)0x0;
    local_78.ptr = (SegmentBuilder *)0x0;
    (pMVar16->forOutput).builder.ptr = pAVar6;
    (pMVar16->forOutput).builder.pos = pAVar1;
    (pMVar16->forOutput).builder.endPtr = pAVar8;
    (pMVar16->forOutput).builder.disposer = pAVar20;
    local_48 = (ArrayPtr<const_capnp::word> *)0x0;
    local_58 = (ArrayPtr<const_capnp::word> *)0x0;
    pAStack_50 = (ArrayPtr<const_capnp::word> *)0x0;
    pDVar3 = (pBVar12->moreSegments).ptr.disposer;
    pMVar5 = (pBVar12->moreSegments).ptr.ptr;
    (pBVar12->moreSegments).ptr.disposer =
         (Disposer *)&kj::_::HeapDisposer<capnp::_::BuilderArena::MultiSegmentState>::instance;
    (pBVar12->moreSegments).ptr.ptr = pMVar16;
    if (pMVar5 != (MultiSegmentState *)0x0) {
      (**pDVar3->_vptr_Disposer)();
    }
    pAVar8 = local_48;
    pAVar6 = pAStack_50;
    pAVar1 = local_58;
    if (local_58 != (ArrayPtr<const_capnp::word> *)0x0) {
      local_58 = (ArrayPtr<const_capnp::word> *)0x0;
      pAStack_50 = (ArrayPtr<const_capnp::word> *)0x0;
      local_48 = (ArrayPtr<const_capnp::word> *)0x0;
      (**local_40->_vptr_ArrayDisposer)
                (local_40,pAVar1,0x10,(long)pAVar6 - (long)pAVar1 >> 4,
                 (long)pAVar8 - (long)pAVar1 >> 4,0);
    }
    pSVar14 = local_68;
    pSVar15 = local_78.ptr;
    pDVar3 = local_78.disposer;
    if (local_78.disposer != (Disposer *)0x0) {
      local_78.disposer = (Disposer *)0x0;
      local_78.ptr = (SegmentBuilder *)0x0;
      local_68 = (SegmentBuilder *)0x0;
      (**local_60->_vptr_ArrayDisposer)
                (local_60,pDVar3,0x10,(long)pSVar15 - (long)pDVar3 >> 4,
                 (long)pSVar14 - (long)pDVar3 >> 4,
                 kj::ArrayDisposer::Dispose_<kj::Own<capnp::_::SegmentBuilder>,_false>::destruct);
    }
    pAVar6 = local_d8.builder.endPtr;
    pRVar7 = local_d8.builder.pos;
    pAVar1 = local_d8.builder.ptr;
    if (local_d8.builder.ptr != (ArrayPtr<const_capnp::word> *)0x0) {
      local_d8.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
      local_d8.builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
      local_d8.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
      (**(local_d8.builder.disposer)->_vptr_ArrayDisposer)
                (local_d8.builder.disposer,pAVar1,0x10,(long)pRVar7 - (long)pAVar1 >> 4,
                 (long)pAVar6 - (long)pAVar1 >> 4,0);
    }
    pOVar11 = local_b8.builder.endPtr;
    pRVar10 = local_b8.builder.pos;
    pOVar9 = local_b8.builder.ptr;
    if (local_b8.builder.ptr != (Own<capnp::_::SegmentBuilder> *)0x0) {
      local_b8.builder.ptr = (Own<capnp::_::SegmentBuilder> *)0x0;
      local_b8.builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
      local_b8.builder.endPtr = (Own<capnp::_::SegmentBuilder> *)0x0;
      (**(local_b8.builder.disposer)->_vptr_ArrayDisposer)
                (local_b8.builder.disposer,pOVar9,0x10,(long)pRVar10 - (long)pOVar9 >> 4,
                 (long)pOVar11 - (long)pOVar9 >> 4,
                 kj::ArrayDisposer::Dispose_<kj::Own<capnp::_::SegmentBuilder>,_false>::destruct);
    }
  }
  return;
}

Assistant:

BuilderArena::BuilderArena(MessageBuilder* message,
                           kj::ArrayPtr<MessageBuilder::SegmentInit> segments)
    : message(message),
      segment0(this, SegmentId(0), segments[0].space.begin(),
               verifySegmentSize(segments[0].space.size()),
               &this->dummyLimiter, verifySegmentSize(segments[0].wordsUsed)) {
  if (segments.size() > 1) {
    kj::Vector<kj::Own<SegmentBuilder>> builders(segments.size() - 1);

    uint i = 1;
    for (auto& segment: segments.slice(1, segments.size())) {
      builders.add(kj::heap<SegmentBuilder>(
          this, SegmentId(i++), segment.space.begin(), verifySegmentSize(segment.space.size()),
          &this->dummyLimiter, verifySegmentSize(segment.wordsUsed)));
    }

    kj::Vector<kj::ArrayPtr<const word>> forOutput;
    forOutput.resize(segments.size());

    segmentWithSpace = builders.back();

    this->moreSegments = kj::heap<MultiSegmentState>(
        MultiSegmentState { kj::mv(builders), kj::mv(forOutput) });

  } else {
    segmentWithSpace = &segment0;
  }
}